

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O0

var * __thiscall cs::type_t::get_var<cs::var_id_const&>(type_t *this,var_id *name)

{
  element_type *peVar1;
  var *pvVar2;
  runtime_error *this_00;
  long in_RDI;
  var_id *in_stack_ffffffffffffff98;
  name_space *in_stack_ffffffffffffffa0;
  allocator local_31;
  string local_30 [48];
  
  peVar1 = std::__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<cs::name_space,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 0x20));
  if (peVar1 != (element_type *)0x0) {
    std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x15fca5);
    pvVar2 = name_space::get_var(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    return pvVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Type doesn\'t have extension field.",&local_31);
  runtime_error::runtime_error(this_00,(string *)in_stack_ffffffffffffff98);
  __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

var &type_t::get_var(T &&name) const
	{
		if (extensions.get() != nullptr)
			return extensions->get_var(name);
		else
			throw runtime_error("Type doesn't have extension field.");
	}